

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_compare.cpp
# Opt level: O1

bool Omega_h::CompareArrays<int>::compare
               (CommPtr *comm,Read<int> *a,Read<int> *b,VarCompareOpts opts,Int ncomps,Int dim,
               bool verbose)

{
  int *piVar1;
  Comm *this;
  Alloc *pAVar2;
  bool x;
  bool bVar3;
  LO LVar4;
  I32 IVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  ostream *poVar9;
  undefined4 in_register_00000084;
  char *__s;
  LO j;
  long lVar10;
  HostRead<int> h_b;
  char local_9d;
  Int local_9c;
  HostRead<int> local_98;
  Read<int> local_88;
  Read<signed_char> local_78;
  HostRead<int> local_68;
  Read<signed_char> local_58;
  Read<int> local_48;
  undefined8 local_38;
  
  if (opts.type == NONE) {
    bVar3 = true;
  }
  else {
    local_38 = CONCAT44(in_register_00000084,dim);
    local_88.write_.shared_alloc_.alloc = (a->write_).shared_alloc_.alloc;
    if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
        local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_88.write_.shared_alloc_.alloc =
             (Alloc *)((local_88.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_88.write_.shared_alloc_.alloc)->use_count =
             (local_88.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_88.write_.shared_alloc_.direct_ptr = (a->write_).shared_alloc_.direct_ptr;
    local_48.write_.shared_alloc_.alloc = (b->write_).shared_alloc_.alloc;
    if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
        local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_48.write_.shared_alloc_.alloc =
             (Alloc *)((local_48.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_48.write_.shared_alloc_.alloc)->use_count =
             (local_48.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_48.write_.shared_alloc_.direct_ptr = (b->write_).shared_alloc_.direct_ptr;
    local_9c = ncomps;
    x = operator==(&local_88,&local_48);
    pAVar2 = local_48.write_.shared_alloc_.alloc;
    if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
        local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_48.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_48.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    pAVar2 = local_88.write_.shared_alloc_.alloc;
    if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
        local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_88.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_88.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    bVar3 = Comm::reduce_and((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr,x);
    if (verbose && !bVar3) {
      local_58.write_.shared_alloc_.alloc = (a->write_).shared_alloc_.alloc;
      if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
          local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_58.write_.shared_alloc_.alloc =
               (Alloc *)((local_58.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_58.write_.shared_alloc_.alloc)->use_count =
               (local_58.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_58.write_.shared_alloc_.direct_ptr = (a->write_).shared_alloc_.direct_ptr;
      HostRead<int>::HostRead(&local_98,&local_58);
      pAVar2 = local_58.write_.shared_alloc_.alloc;
      if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
          local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_58.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_58.write_.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
        }
      }
      local_78.write_.shared_alloc_.alloc = (b->write_).shared_alloc_.alloc;
      if (((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
          local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_78.write_.shared_alloc_.alloc =
               (Alloc *)((local_78.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_78.write_.shared_alloc_.alloc)->use_count =
               (local_78.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_78.write_.shared_alloc_.direct_ptr = (b->write_).shared_alloc_.direct_ptr;
      HostRead<int>::HostRead(&local_68,&local_78);
      pAVar2 = local_78.write_.shared_alloc_.alloc;
      if (((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
          local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_78.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_78.write_.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
        }
      }
      this = (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      LVar4 = HostRead<int>::size(&local_98);
      Comm::exscan<long>(this,(long)LVar4,OMEGA_H_SUM);
      IVar5 = 0x7fffffff;
      if (!x) {
        IVar5 = Comm::rank((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr);
      }
      iVar6 = Comm::allreduce<int>
                        ((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr,IVar5,OMEGA_H_MIN);
      IVar5 = Comm::rank((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
      if (IVar5 == iVar6) {
        lVar10 = 0;
        while( true ) {
          LVar4 = HostRead<int>::size(&local_98);
          if (LVar4 <= lVar10) break;
          if (*(int *)((long)local_98.read_.write_.shared_alloc_.direct_ptr + lVar10 * 4) !=
              *(int *)((long)local_68.read_.write_.shared_alloc_.direct_ptr + lVar10 * 4)) {
            uVar7 = (int)local_38 - 1;
            if (uVar7 < 3) {
              __s = (&PTR_anon_var_dwarf_679a4_004c4890)[uVar7];
            }
            else {
              __s = (char *)0x0;
              if ((int)local_38 == 0) {
                __s = "vertex";
              }
            }
            if (__s == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x4cf378);
            }
            else {
              sVar8 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar8);
            }
            local_9d = ' ';
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,&local_9d,1);
            poVar9 = std::ostream::_M_insert<long>((long)poVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," comp ",6);
            poVar9 = std::ostream::_M_insert<long>((long)poVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            poVar9 = std::ostream::_M_insert<long>((long)poVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," != ",4);
            poVar9 = std::ostream::_M_insert<long>((long)poVar9);
            local_9d = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_9d,1);
            break;
          }
          lVar10 = lVar10 + 1;
        }
      }
      if (((ulong)local_68.read_.write_.shared_alloc_.alloc & 7) == 0 &&
          local_68.read_.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_68.read_.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_68.read_.write_.shared_alloc_.alloc);
          operator_delete(local_68.read_.write_.shared_alloc_.alloc,0x48);
        }
      }
      if (((ulong)local_98.read_.write_.shared_alloc_.alloc & 7) == 0 &&
          local_98.read_.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_98.read_.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_98.read_.write_.shared_alloc_.alloc);
          operator_delete(local_98.read_.write_.shared_alloc_.alloc,0x48);
        }
      }
    }
  }
  return bVar3;
}

Assistant:

static bool compare(CommPtr comm, Read<T> a, Read<T> b, VarCompareOpts opts,
      Int ncomps, Int dim, bool verbose) {
    if (opts.type == VarCompareOpts::NONE) return true;
    auto this_rank_matches = (a == b);
    if (comm->reduce_and(this_rank_matches)) return true;
    if (!verbose) return false;
    /* if integer arrays are different, we find the first mismatching
       value and print it out as a place for users to start
       tracking down the issue */
    auto h_a = HostRead<T>(a);
    auto h_b = HostRead<T>(b);
    auto global_start = comm->exscan(GO(h_a.size()), OMEGA_H_SUM);
    I32 rank_cand = ArithTraits<I32>::max();
    if (!this_rank_matches) rank_cand = comm->rank();
    // only the first mismatching rank prints
    auto best_rank = comm->allreduce(rank_cand, OMEGA_H_MIN);
    if (comm->rank() == best_rank) {
      for (LO j = 0; j < h_a.size(); ++j) {
        // and it only prints its first mismatching value
        if (h_a[j] != h_b[j]) {
          auto global_comp = global_start + GO(j);
          auto global_ent = global_comp / ncomps;
          auto comp = global_comp % ncomps;
          std::cout << dimensional_singular_name(dim) << ' ' << global_ent
                    << " comp " << comp << " " << I64(h_a[j])
                    << " != " << I64(h_b[j]) << '\n';
          break;
        }
      }
    }
    return false;
  }